

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int udp_pipe_get_remaddr(void *arg,void *v,size_t *szp,nni_type t)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 8));
  iVar2 = nni_copyout_sockaddr((nng_sockaddr *)((long)arg + 0x10),v,szp,t);
  nni_mtx_unlock((nni_mtx *)(lVar1 + 8));
  return iVar2;
}

Assistant:

static int
udp_pipe_get_remaddr(void *arg, void *v, size_t *szp, nni_type t)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;
	int       rv;
	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_sockaddr(&p->peer_addr, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}